

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::BinaryRegistryWriter
          (BinaryRegistryWriter *this,string *dstPath)

{
  bool bVar1;
  FilePath local_48;
  string *local_18;
  string *dstPath_local;
  BinaryRegistryWriter *this_local;
  
  this->m_dstPath = dstPath;
  local_18 = dstPath;
  dstPath_local = (string *)this;
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::vector(&this->m_binaryIndices);
  BinaryIndexHash::BinaryIndexHash(&this->m_binaryHash);
  std::
  vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ::vector(&this->m_binaries);
  de::FilePath::FilePath(&local_48,local_18);
  bVar1 = de::FilePath::exists(&local_48);
  de::FilePath::~FilePath(&local_48);
  if (bVar1) {
    initFromPath(this,local_18);
  }
  return;
}

Assistant:

BinaryRegistryWriter::BinaryRegistryWriter (const std::string& dstPath)
	: m_dstPath(dstPath)
{
	if (de::FilePath(dstPath).exists())
		initFromPath(dstPath);
}